

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void sig_handler(int signum)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _List_node_base *p_Var2;
  int iVar3;
  _List_node_base *p_Var4;
  Player PStack_58;
  
  if ((signum != 0xf) && (signum != 2)) {
    printf("Unrecognized signal captured: %d",(ulong)(uint)signum);
    return;
  }
  close(server_sock);
  if (game_list_abi_cxx11_.super__List_base<TTTGame_*,_std::allocator<TTTGame_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&game_list_abi_cxx11_) {
    paVar1 = &PStack_58.m_name.field_2;
    p_Var4 = game_list_abi_cxx11_.super__List_base<TTTGame_*,_std::allocator<TTTGame_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    do {
      TTTGame::GetPlayer1(&PStack_58,(TTTGame *)p_Var4[1]._M_next);
      iVar3 = Player::GetSocket(&PStack_58);
      close(iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)PStack_58.m_name._M_dataplus._M_p != paVar1) {
        operator_delete(PStack_58.m_name._M_dataplus._M_p);
      }
      TTTGame::GetPlayer2(&PStack_58,(TTTGame *)p_Var4[1]._M_next);
      iVar3 = Player::GetSocket(&PStack_58);
      close(iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)PStack_58.m_name._M_dataplus._M_p != paVar1) {
        operator_delete(PStack_58.m_name._M_dataplus._M_p);
      }
      p_Var2 = p_Var4[1]._M_next;
      if (p_Var2 != (_List_node_base *)0x0) {
        if (p_Var2[6]._M_next != p_Var2 + 7) {
          operator_delete(p_Var2[6]._M_next);
        }
        if (p_Var2[3]._M_prev != (_List_node_base *)&p_Var2[4]._M_prev) {
          operator_delete(p_Var2[3]._M_prev);
        }
        if (p_Var2->_M_prev != (_List_node_base *)&p_Var2[1]._M_prev) {
          operator_delete(p_Var2->_M_prev);
        }
      }
      operator_delete(p_Var2);
      p_Var4 = (((_List_base<TTTGame_*,_std::allocator<TTTGame_*>_> *)&p_Var4->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)&game_list_abi_cxx11_);
  }
  std::__cxx11::list<TTTGame_*,_std::allocator<TTTGame_*>_>::clear(&game_list_abi_cxx11_);
  puts("Exiting server");
  exit(0);
}

Assistant:

void sig_handler(int signum)
{
    switch(signum)
    {
        case SIGTERM:
        case SIGINT:
            close(server_sock);

            // Dynamically delete every game in the list and close every connected client
            for(auto iter = game_list.begin(); iter != game_list.end(); ++iter)
            {
                close((*iter)->GetPlayer1().GetSocket());
                close((*iter)->GetPlayer2().GetSocket());

                // Remove the game
                delete *iter;
            }

            game_list.clear();

            printf("Exiting server\n");
            exit(0);
            break;
        default: printf("Unrecognized signal captured: %d", signum);
    }
}